

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::FileOptions::SerializeWithCachedSizesToArray(FileOptions *this,uint8 *target)

{
  bool bVar1;
  int32 value;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  uint uVar4;
  uint8 *puVar5;
  Type *this_00;
  int i;
  int index;
  
  uVar4 = this->_has_bits_[0];
  if ((uVar4 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->java_package_->_M_dataplus)._M_p,(int)this->java_package_->_M_string_length,
               SERIALIZE);
    psVar2 = this->java_package_;
    *target = '\n';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar2->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar2,puVar5);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->java_outer_classname_->_M_dataplus)._M_p,
               (int)this->java_outer_classname_->_M_string_length,SERIALIZE);
    psVar2 = this->java_outer_classname_;
    *target = 'B';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar2->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar2,puVar5);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 0x10) != 0) {
    value = this->optimize_for_;
    *target = 'H';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,target + 1);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 4) != 0) {
    bVar1 = this->java_multiple_files_;
    *target = 'P';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 1);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 0x20) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->go_package_->_M_dataplus)._M_p,(int)this->go_package_->_M_string_length,
               SERIALIZE);
    psVar2 = this->go_package_;
    *target = 'Z';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar2->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar2,puVar5);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 0x40) != 0) {
    bVar1 = this->cc_generic_services_;
    target[0] = 0x80;
    target[1] = '\x01';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 2);
    uVar4 = this->_has_bits_[0];
  }
  if ((char)uVar4 < '\0') {
    bVar1 = this->java_generic_services_;
    target[0] = 0x88;
    target[1] = '\x01';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 2);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 >> 8 & 1) != 0) {
    bVar1 = this->py_generic_services_;
    target[0] = 0x90;
    target[1] = '\x01';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 2);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 8) != 0) {
    bVar1 = this->java_generate_equals_and_hash_;
    target[0] = 0xa0;
    target[1] = '\x01';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 2);
  }
  for (index = 0; index < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      index = index + 1) {
    this_00 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    target[0] = 0xba;
    target[1] = '>';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(this_00->_cached_size_,target + 2);
    target = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,puVar5);
  }
  puVar5 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,target);
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,puVar5);
    return puVar5;
  }
  return puVar5;
}

Assistant:

::google::protobuf::uint8* FileOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string java_package = 1;
  if (has_java_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->java_package().data(), this->java_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->java_package(), target);
  }

  // optional string java_outer_classname = 8;
  if (has_java_outer_classname()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->java_outer_classname().data(), this->java_outer_classname().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->java_outer_classname(), target);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if (has_optimize_for()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      9, this->optimize_for(), target);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if (has_java_multiple_files()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->java_multiple_files(), target);
  }

  // optional string go_package = 11;
  if (has_go_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->go_package().data(), this->go_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        11, this->go_package(), target);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if (has_cc_generic_services()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(16, this->cc_generic_services(), target);
  }

  // optional bool java_generic_services = 17 [default = false];
  if (has_java_generic_services()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(17, this->java_generic_services(), target);
  }

  // optional bool py_generic_services = 18 [default = false];
  if (has_py_generic_services()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(18, this->py_generic_services(), target);
  }

  // optional bool java_generate_equals_and_hash = 20 [default = false];
  if (has_java_generate_equals_and_hash()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(20, this->java_generate_equals_and_hash(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}